

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_checksum_finish(archive_read *a)

{
  void *pvVar1;
  uint *puVar2;
  uint32_t uVar3;
  int local_2c;
  wchar_t l;
  cfdata *cfdata;
  cab *cab;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  puVar2 = *(uint **)((long)pvVar1 + 0x38);
  if (*puVar2 == 0) {
    a_local._4_4_ = L'\0';
  }
  else {
    if (puVar2[0xc] != 0) {
      uVar3 = cab_checksum_cfdata(puVar2 + 0xb,(long)(int)puVar2[0xc],puVar2[10]);
      puVar2[10] = uVar3;
      puVar2[0xc] = 0;
    }
    local_2c = 4;
    if ((*(ushort *)((long)pvVar1 + 0x54) & 4) != 0) {
      local_2c = *(byte *)((long)pvVar1 + 0x5d) + 4;
    }
    uVar3 = cab_checksum_cfdata((void *)(*(long *)(puVar2 + 8) + 4),(long)local_2c,puVar2[10]);
    puVar2[10] = uVar3;
    if (puVar2[10] == *puVar2) {
      a_local._4_4_ = L'\0';
    }
    else {
      archive_set_error(&a->archive,0x54,"Checksum error CFDATA[%d] %x:%x in %d bytes",
                        (ulong)(*(int *)(*(long *)((long)pvVar1 + 0x28) + 0x58) - 1),(ulong)*puVar2,
                        (ulong)puVar2[10],(uint)(ushort)puVar2[1]);
      a_local._4_4_ = L'\xffffffe7';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
cab_checksum_finish(struct archive_read *a)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata = cab->entry_cfdata;
	int l;

	/* Do not need to compute a sum. */
	if (cfdata->sum == 0)
		return (ARCHIVE_OK);

	/*
	 * Calculate the sum of remaining CFDATA.
	 */
	if (cfdata->sum_extra_avail) {
		cfdata->sum_calculated =
		    cab_checksum_cfdata(cfdata->sum_extra,
		       cfdata->sum_extra_avail, cfdata->sum_calculated);
		cfdata->sum_extra_avail = 0;
	}

	l = 4;
	if (cab->cfheader.flags & RESERVE_PRESENT)
		l += cab->cfheader.cfdata;
	cfdata->sum_calculated = cab_checksum_cfdata(
	    cfdata->memimage + CFDATA_cbData, l, cfdata->sum_calculated);
	if (cfdata->sum_calculated != cfdata->sum) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Checksum error CFDATA[%d] %x:%x in %d bytes",
		    cab->entry_cffolder->cfdata_index -1,
		    cfdata->sum, cfdata->sum_calculated,
		    cfdata->compressed_size);
		return (ARCHIVE_FAILED);
	}
	return (ARCHIVE_OK);
}